

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire.c
# Opt level: O0

void nn_putll(uint8_t *buf,uint64_t val)

{
  uint64_t val_local;
  uint8_t *buf_local;
  
  *buf = (uint8_t)(val >> 0x38);
  buf[1] = (uint8_t)(val >> 0x30);
  buf[2] = (uint8_t)(val >> 0x28);
  buf[3] = (uint8_t)(val >> 0x20);
  buf[4] = (uint8_t)(val >> 0x18);
  buf[5] = (uint8_t)(val >> 0x10);
  buf[6] = (uint8_t)(val >> 8);
  buf[7] = (uint8_t)val;
  return;
}

Assistant:

void nn_putll (uint8_t *buf, uint64_t val)
{
    buf [0] = (uint8_t) ((val >> 56) & 0xff);
    buf [1] = (uint8_t) ((val >> 48) & 0xff);
    buf [2] = (uint8_t) ((val >> 40) & 0xff);
    buf [3] = (uint8_t) ((val >> 32) & 0xff);
    buf [4] = (uint8_t) ((val >> 24) & 0xff);
    buf [5] = (uint8_t) ((val >> 16) & 0xff);
    buf [6] = (uint8_t) ((val >> 8) & 0xff);
    buf [7] = (uint8_t) (val & 0xff);
}